

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_ring_multiply(uint16_t *out,uint16_t *a,uint16_t *b,uint p,uint q)

{
  int *piVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  uint16_t uVar4;
  uint uVar5;
  void *b_00;
  uint64_t qrecip;
  ulong uVar6;
  uint i;
  ulong uVar7;
  ulong uVar8;
  uint j;
  ulong uVar9;
  ulong factor1;
  
  uVar5 = p * 2;
  factor1 = (ulong)uVar5;
  b_00 = safemalloc(factor1,4,0);
  for (uVar7 = 0; factor1 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined4 *)((long)b_00 + uVar7 * 4) = 0;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (ulong)q & 0xffff;
  qrecip = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / auVar3,0);
  uVar7 = (ulong)p;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    uVar2 = a[uVar8];
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      uVar6 = (ulong)(uint)((int)uVar8 + (int)uVar9);
      uVar4 = reduce((uint)b[uVar9] * (uint)uVar2 + *(int *)((long)b_00 + uVar6 * 4),(uint16_t)q,
                     qrecip);
      *(uint *)((long)b_00 + uVar6 * 4) = (uint)uVar4;
    }
  }
  uVar8 = (ulong)p;
  while (uVar5 = uVar5 - 1, p <= uVar5) {
    uVar6 = (ulong)uVar5;
    uVar9 = (ulong)((int)uVar8 - 1);
    piVar1 = (int *)((long)b_00 + uVar9 * 4);
    *piVar1 = *piVar1 + *(int *)((long)b_00 + uVar6 * 4);
    piVar1 = (int *)((long)b_00 + uVar8 * 4);
    *piVar1 = *piVar1 + *(int *)((long)b_00 + uVar6 * 4);
    *(undefined4 *)((long)b_00 + uVar6 * 4) = 0;
    uVar8 = uVar9;
  }
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    uVar4 = reduce(*(uint32_t *)((long)b_00 + uVar8 * 4),(uint16_t)q,qrecip);
    out[uVar8] = uVar4;
  }
  smemclr(b_00,factor1 << 2);
  safefree(b_00);
  return;
}

Assistant:

void ntru_ring_multiply(uint16_t *out, const uint16_t *a, const uint16_t *b,
                        unsigned p, unsigned q)
{
    SETUP;

    /*
     * Strategy: just compute the full product with 2p coefficients,
     * and then reduce it mod x^p-x-1 by working downwards from the
     * top coefficient replacing x^{p+k} with (x+1)x^k for k = ...,1,0.
     *
     * Possibly some speed could be gained here by doing the recursive
     * Karatsuba optimisation for the initial multiplication? But I
     * haven't tried it.
     */
    uint32_t *unreduced = snewn(2*p, uint32_t);
    for (unsigned i = 0; i < 2*p; i++)
        unreduced[i] = 0;
    for (unsigned i = 0; i < p; i++)
        for (unsigned j = 0; j < p; j++)
            unreduced[i+j] = REDUCE(unreduced[i+j] + a[i] * b[j]);

    for (unsigned i = 2*p - 1; i >= p; i--) {
        unreduced[i-p] += unreduced[i];
        unreduced[i-p+1] += unreduced[i];
        unreduced[i] = 0;
    }

    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(unreduced[i]);

    smemclr(unreduced, 2*p * sizeof(*unreduced));
    sfree(unreduced);
}